

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatumSpecification.cpp
# Opt level: O3

void __thiscall DIS::DatumSpecification::marshal(DatumSpecification *this,DataStream *dataStream)

{
  undefined8 *puVar1;
  pointer pFVar2;
  pointer pVVar3;
  long lVar4;
  ulong uVar5;
  FixedDatum x;
  VariableDatum local_60;
  
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_fixedDatumIDList).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_fixedDatumIDList).
                                 super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (int)((ulong)((long)(this->_variableDatumIDList).
                                 super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_variableDatumIDList).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555);
  pFVar2 = (this->_fixedDatumIDList).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatumIDList).
      super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar2) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__FixedDatum_001b4c68;
      local_60._8_8_ = *(undefined8 *)((long)&pFVar2->_vptr_FixedDatum + lVar4);
      FixedDatum::marshal((FixedDatum *)&local_60,dataStream);
      FixedDatum::~FixedDatum((FixedDatum *)&local_60);
      uVar5 = uVar5 + 1;
      pFVar2 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(this->_fixedDatumIDList).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4));
  }
  pVVar3 = (this->_variableDatumIDList).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumIDList).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001b6628;
      puVar1 = (undefined8 *)((long)pVVar3 + lVar4 + -0x10);
      local_60._8_8_ = *puVar1;
      local_60._16_8_ = puVar1[1];
      std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::vector
                (&local_60._variableDatums,
                 (vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_> *)
                 ((long)&pVVar3->_vptr_VariableDatum + lVar4));
      VariableDatum::marshal(&local_60,dataStream);
      VariableDatum::~VariableDatum(&local_60);
      uVar5 = uVar5 + 1;
      pVVar3 = (this->_variableDatumIDList).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 < (ulong)(((long)(this->_variableDatumIDList).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void DatumSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_fixedDatumIDList.size();
    dataStream << ( unsigned int )_variableDatumIDList.size();

     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        FixedDatum x = _fixedDatumIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        VariableDatum x = _variableDatumIDList[idx];
        x.marshal(dataStream);
     }

}